

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O3

void __thiscall cmCoreTryCompile::FindOutputFile(cmCoreTryCompile *this,string *targetName)

{
  cmMakefile *this_00;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  cmGlobalGenerator *pcVar4;
  string *psVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  string command;
  string outputFileLocation;
  string tmpOutputFile;
  string tcConfig;
  ostringstream emsg_1;
  ifstream ifs;
  string local_470;
  string local_450;
  long *local_430;
  pointer local_428;
  long local_420 [2];
  string local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  char *local_3d8;
  undefined8 local_3d0;
  string local_3c8;
  undefined1 local_3a8 [8];
  char *local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_388;
  undefined8 local_380;
  undefined8 local_378;
  char *local_370;
  undefined8 local_368;
  ios_base local_338 [264];
  undefined1 local_230 [32];
  long *local_210;
  undefined8 local_208;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  undefined8 local_1f0;
  ios_base local_1c0 [408];
  
  (this->FindErrorMessage)._M_string_length = 0;
  *(this->FindErrorMessage)._M_dataplus._M_p = '\0';
  (this->OutputFile)._M_string_length = 0;
  *(this->OutputFile)._M_dataplus._M_p = '\0';
  local_430 = local_420;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"/","");
  std::__cxx11::string::_M_append((char *)&local_430,(ulong)(targetName->_M_dataplus)._M_p);
  pcVar4 = cmMakefile::GetGlobalGenerator(this->Makefile);
  iVar3 = (*pcVar4->_vptr_cmGlobalGenerator[0x28])(pcVar4);
  if ((char)iVar3 != '\0') {
    this_00 = this->Makefile;
    local_230._0_8_ = local_230 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_230,"CMAKE_TRY_COMPILE_CONFIGURATION","");
    psVar5 = cmMakefile::GetSafeDefinition(this_00,(string *)local_230);
    pcVar1 = (psVar5->_M_dataplus)._M_p;
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_410,pcVar1,pcVar1 + psVar5->_M_string_length);
    if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
      operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
    }
    if ((char *)local_410._M_string_length == (char *)0x0) {
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_470,(anonymous_namespace)::TryCompileDefaultConfig_abi_cxx11_,
                 DAT_00a37c38 + (anonymous_namespace)::TryCompileDefaultConfig_abi_cxx11_);
    }
    else {
      cmsys::SystemTools::UpperCase(&local_470,&local_410);
    }
    local_230._0_8_ = local_428;
    local_230._8_8_ = local_430;
    local_230._16_8_ = 0;
    local_398._M_allocated_capacity = (size_type)(local_398._M_local_buf + 8);
    local_3a8 = (undefined1  [8])0x0;
    local_3a0 = (char *)0x1;
    local_398._M_local_buf[8] = 0x5f;
    local_230._24_8_ = 1;
    local_208 = 0;
    local_200 = local_470._M_string_length;
    local_1f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_470._M_dataplus._M_p;
    local_1f0 = 0;
    views._M_len = 3;
    views._M_array = (iterator)local_230;
    local_210 = (long *)local_398._M_allocated_capacity;
    cmCatViews(&local_450,views);
    std::__cxx11::string::operator=((string *)&local_430,(string *)&local_450);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,
                      CONCAT71(local_450.field_2._M_allocated_capacity._1_7_,
                               local_450.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)&local_430);
  local_230._8_8_ = (this->BinaryDirectory)._M_dataplus._M_p;
  local_230._0_8_ = (this->BinaryDirectory)._M_string_length;
  local_230._16_8_ = 0;
  local_230._24_8_ = local_428;
  local_210 = local_430;
  local_208 = 0;
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_230;
  cmCatViews(&local_470,views_00);
  bVar2 = cmsys::SystemTools::FileExists(&local_470);
  if (bVar2) {
    local_450._M_string_length = 0;
    local_450.field_2._M_local_buf[0] = '\0';
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::ifstream::ifstream(local_230,local_470._M_dataplus._M_p,_S_in);
    cmsys::SystemTools::GetLineFromStream
              ((istream *)local_230,&local_450,(bool *)0x0,0xffffffffffffffff);
    bVar2 = cmsys::SystemTools::FileExists(&local_450);
    if (bVar2) {
      cmsys::SystemTools::CollapseFullPath((string *)local_3a8,&local_450);
      std::__cxx11::string::operator=((string *)&this->OutputFile,(string *)local_3a8);
      if (local_3a8 != (undefined1  [8])&local_398) {
        operator_delete((void *)local_3a8,(ulong)(local_398._M_allocated_capacity + 1));
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3a8,"Recorded try_compile output location doesn\'t exist:\n",0x34)
      ;
      local_410._M_dataplus._M_p = (pointer)0x2;
      local_410._M_string_length = 0x7b3c04;
      local_410.field_2._M_allocated_capacity = 0;
      local_410.field_2._8_8_ = local_450._M_string_length;
      local_3f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_450._M_dataplus._M_p;
      local_3e8 = 0;
      local_3e0 = 1;
      local_3d8 = "\n";
      local_3d0 = 0;
      views_02._M_len = 3;
      views_02._M_array = (iterator)&local_410;
      cmCatViews(&local_3c8,views_02);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3a8,local_3c8._M_dataplus._M_p,local_3c8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&this->FindErrorMessage,(string *)&local_410);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
      std::ios_base::~ios_base(local_338);
    }
    std::ifstream::~ifstream(local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,
                      CONCAT71(local_450.field_2._M_allocated_capacity._1_7_,
                               local_450.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,"Unable to find the recorded try_compile output location:\n",
               0x39);
    local_3a8 = (undefined1  [8])0x2;
    local_3a0 = "  ";
    local_398._M_allocated_capacity = 0;
    local_398._8_8_ = local_470._M_string_length;
    local_388 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_470._M_dataplus._M_p;
    local_380 = 0;
    local_378 = 1;
    local_370 = "\n";
    local_368 = 0;
    views_01._M_len = 3;
    views_01._M_array = (iterator)local_3a8;
    cmCatViews(&local_410,views_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,local_410._M_dataplus._M_p,local_410._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->FindErrorMessage,(string *)local_3a8);
    if (local_3a8 != (undefined1  [8])&local_398) {
      operator_delete((void *)local_3a8,(ulong)(local_398._M_allocated_capacity + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
    std::ios_base::~ios_base(local_1c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if (local_430 != local_420) {
    operator_delete(local_430,local_420[0] + 1);
  }
  return;
}

Assistant:

void cmCoreTryCompile::FindOutputFile(const std::string& targetName)
{
  this->FindErrorMessage.clear();
  this->OutputFile.clear();
  std::string tmpOutputFile = "/";
  tmpOutputFile += targetName;

  if (this->Makefile->GetGlobalGenerator()->IsMultiConfig()) {
    std::string const tcConfig =
      this->Makefile->GetSafeDefinition("CMAKE_TRY_COMPILE_CONFIGURATION");
    std::string const cfg = !tcConfig.empty()
      ? cmSystemTools::UpperCase(tcConfig)
      : TryCompileDefaultConfig;
    tmpOutputFile = cmStrCat(tmpOutputFile, '_', cfg);
  }
  tmpOutputFile += "_loc";

  std::string command = cmStrCat(this->BinaryDirectory, tmpOutputFile);
  if (!cmSystemTools::FileExists(command)) {
    std::ostringstream emsg;
    emsg << "Unable to find the recorded try_compile output location:\n";
    emsg << cmStrCat("  ", command, "\n");
    this->FindErrorMessage = emsg.str();
    return;
  }

  std::string outputFileLocation;
  cmsys::ifstream ifs(command.c_str());
  cmSystemTools::GetLineFromStream(ifs, outputFileLocation);
  if (!cmSystemTools::FileExists(outputFileLocation)) {
    std::ostringstream emsg;
    emsg << "Recorded try_compile output location doesn't exist:\n";
    emsg << cmStrCat("  ", outputFileLocation, "\n");
    this->FindErrorMessage = emsg.str();
    return;
  }

  this->OutputFile = cmSystemTools::CollapseFullPath(outputFileLocation);
}